

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathShear.h
# Opt level: O0

void __thiscall
Imath_3_2::Shear6<float>::Shear6
          (Shear6<float> *this,float XY,float XZ,float YZ,float YX,float ZX,float ZY)

{
  float ZY_local;
  float ZX_local;
  float YX_local;
  float YZ_local;
  float XZ_local;
  float XY_local;
  Shear6<float> *this_local;
  
  this->xy = XY;
  this->xz = XZ;
  this->yz = YZ;
  this->yx = YX;
  this->zx = ZX;
  this->zy = ZY;
  return;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Shear6<T>::Shear6 (
    T XY, T XZ, T YZ, T YX, T ZX, T ZY)
{
    xy = XY;
    xz = XZ;
    yz = YZ;
    yx = YX;
    zx = ZX;
    zy = ZY;
}